

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setFragment(QUrl *this,QString *fragment,ParsingMode mode)

{
  uchar *puVar1;
  bool bVar2;
  
  detach(this);
  QUrlPrivate::clearError(this->d);
  QUrlPrivate::setFragment<QString_const&>(this->d,fragment,mode);
  if ((fragment->d).ptr == (char16_t *)0x0) {
    puVar1 = &this->d->sectionIsPresent;
    *puVar1 = *puVar1 & 0x7f;
  }
  else if (mode == StrictMode) {
    bVar2 = QUrlPrivate::validateComponent(this->d,Fragment,fragment);
    if (!bVar2) {
      QString::clear(&this->d->fragment);
      return;
    }
  }
  return;
}

Assistant:

void QUrl::setFragment(const QString &fragment, ParsingMode mode)
{
    detach();
    d->clearError();

    d->setFragment(fragment, mode);
    if (fragment.isNull())
        d->sectionIsPresent &= ~QUrlPrivate::Fragment;
    else if (mode == StrictMode && !d->validateComponent(QUrlPrivate::Fragment, fragment))
        d->fragment.clear();
}